

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Iter __thiscall mocker::ir::Interpreter::readStringLiteral(Interpreter *this,Iter iter,Iter end)

{
  char cVar1;
  uint __line;
  char *pcVar2;
  
  if (iter._M_current < end._M_current) {
    if (*iter._M_current == '\"') {
      pcVar2 = iter._M_current + 1;
      do {
        while (cVar1 = *pcVar2, cVar1 != '\\') {
          pcVar2 = pcVar2 + 1;
          if (cVar1 == '\"') {
            return (Iter)pcVar2;
          }
          if (pcVar2 == end._M_current) {
            pcVar2 = "iter != end";
            __line = 0x4f;
            goto LAB_00106e77;
          }
        }
        pcVar2 = pcVar2 + 2;
      } while (pcVar2 < end._M_current);
      pcVar2 = "iter < end";
      __line = 0x4b;
    }
    else {
      pcVar2 = "*iter == \'\\\"\'";
      __line = 0x46;
    }
  }
  else {
    pcVar2 = "iter < end";
    __line = 0x45;
  }
LAB_00106e77:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                ,__line,
                "Interpreter::Iter mocker::ir::Interpreter::readStringLiteral(Interpreter::Iter, Interpreter::Iter) const"
               );
}

Assistant:

Interpreter::Iter Interpreter::readStringLiteral(Interpreter::Iter iter,
                                                 Interpreter::Iter end) const {
  assert(iter < end);
  assert(*iter == '\"');
  ++iter;
  while (*iter != '\"') {
    if (*iter == '\\') {
      iter += 2;
      assert(iter < end);
      continue;
    }
    ++iter;
    assert(iter != end);
  }
  return iter + 1;
}